

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_tri_normal(REF_NODE ref_node,REF_INT *nodes,REF_DBL *normal)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  REF_GLOB *pRVar5;
  REF_DBL *pRVar6;
  
  iVar1 = *nodes;
  if (((-1 < (long)iVar1) && (iVar2 = ref_node->max, iVar1 < iVar2)) &&
     (pRVar5 = ref_node->global, -1 < pRVar5[iVar1])) {
    uVar3 = nodes[1];
    if (((int)uVar3 < iVar2 && -1 < (int)uVar3) && (-1 < pRVar5[uVar3])) {
      uVar4 = nodes[2];
      if (((int)uVar4 < iVar2 && -1 < (int)uVar4) && (-1 < pRVar5[uVar4])) {
        pRVar6 = ref_node->real;
        ref_node_xyz_normal(pRVar6 + (uint)(iVar1 * 0xf),pRVar6 + uVar3 * 0xf,pRVar6 + uVar4 * 0xf,
                            normal);
        return 0;
      }
    }
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x8d7,
         "ref_node_tri_normal",3,"node invalid");
  return 3;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_normal(REF_NODE ref_node, REF_INT *nodes,
                                       REF_DBL *normal) {
  REF_DBL *xyz0, *xyz1, *xyz2;

  if (!ref_node_valid(ref_node, nodes[0]) ||
      !ref_node_valid(ref_node, nodes[1]) ||
      !ref_node_valid(ref_node, nodes[2]))
    RSS(REF_INVALID, "node invalid");

  xyz0 = ref_node_xyz_ptr(ref_node, nodes[0]);
  xyz1 = ref_node_xyz_ptr(ref_node, nodes[1]);
  xyz2 = ref_node_xyz_ptr(ref_node, nodes[2]);

  RSS(ref_node_xyz_normal(xyz0, xyz1, xyz2, normal), "xyz norm");

  return REF_SUCCESS;
}